

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O2

int __thiscall
iutest::detail::ParamTestSuiteInfo<PairwiseTest2>::AddTestSuiteInstantiation
          (ParamTestSuiteInfo<PairwiseTest2> *this,string *name,pfnCreateGeneratorFunc create_func,
          pfnParamNameGeneratorFunc paramname_func,char *file,int line)

{
  Functor local_20;
  
  local_20.CreateGen = create_func;
  local_20.ParamNameGen = paramname_func;
  local_20.m_file = file;
  local_20.m_line = line;
  std::
  vector<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<PairwiseTest2>::Functor>,std::allocator<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<PairwiseTest2>::Functor>>>
  ::emplace_back<std::__cxx11::string&,iutest::detail::ParamTestSuiteInfo<PairwiseTest2>::Functor>
            ((vector<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<PairwiseTest2>::Functor>,std::allocator<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<PairwiseTest2>::Functor>>>
              *)&this->m_instantiation,name,&local_20);
  return 0;
}

Assistant:

int AddTestSuiteInstantiation(::std::string name
        , pfnCreateGeneratorFunc create_func, pfnParamNameGeneratorFunc paramname_func
        , const char* file, int line)
    {
#if IUTEST_HAS_STD_EMPLACE
        m_instantiation.emplace_back(name, Functor(create_func, paramname_func, file, line));
#else
        m_instantiation.push_back(InstantiationPair(name, Functor(create_func, paramname_func, file, line)));
#endif
        return 0;
    }